

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

QChar * __thiscall
QUtf16::convertToUnicode
          (QUtf16 *this,QChar *out,QByteArrayView in,State *state,DataEndianness endian)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  QChar QVar5;
  QUtf16 QVar6;
  uint *puVar7;
  QUtf16 *pQVar8;
  QUtf16 *__src;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  QUtf16 *pQVar12;
  
  uVar11 = (uint)state;
  puVar7 = (uint *)in.m_data;
  pQVar8 = (QUtf16 *)in.m_size;
  if (uVar11 == 0) {
    uVar11 = puVar7[6];
  }
  lVar1 = *(long *)(puVar7 + 2);
  if ((long)&out->ucs + lVar1 < 2) {
    if (out == (QChar *)0x0) {
      return (QChar *)this;
    }
    puVar7[2] = 1;
    puVar7[3] = 0;
    QVar6 = *pQVar8;
  }
  else {
    if (puVar7 == (uint *)0x0) {
      bVar10 = 0;
    }
    else {
      bVar10 = (byte)puVar7[1];
    }
    bVar4 = ((byte)*puVar7 & 8) >> 3;
    if ((lVar1 == 0) && (bVar4 != 0 || (bVar10 & 1) != 0)) {
      __src = pQVar8;
      uVar9 = 2;
      if (uVar11 != 0) {
        uVar9 = uVar11;
      }
    }
    else {
      if (lVar1 == 0) {
        QVar6 = *pQVar8;
        pQVar12 = pQVar8 + 1;
      }
      else {
        QVar6 = *(QUtf16 *)(puVar7 + 7);
        pQVar12 = pQVar8;
      }
      *(byte *)(puVar7 + 1) = (byte)puVar7[1] | 1;
      uVar2 = CONCAT11(*pQVar12,QVar6);
      uVar9 = (uVar2 != 0xfffe) + 1;
      if (uVar11 != 0) {
        uVar9 = uVar11;
      }
      uVar3 = uVar2 << 8 | (ushort)(byte)*pQVar12;
      if (uVar9 != 1) {
        uVar3 = uVar2;
      }
      __src = pQVar12 + 1;
      if ((bVar4 != 0 || (bVar10 & 1) != 0) || uVar3 != 0xfeff) {
        *(ushort *)this = uVar3;
        this = this + 2;
      }
    }
    pQVar12 = pQVar8 + ((long)&out->ucs - (long)__src);
    if (uVar9 == 1) {
      qbswap<2>(__src,(long)pQVar12 >> 1,this);
    }
    else if (__src != this) {
      memcpy(this,__src,(ulong)pQVar12 & 0xfffffffffffffffe);
    }
    this = this + ((long)pQVar12 >> 1) * 2;
    puVar7[6] = uVar9;
    puVar7[2] = 0;
    puVar7[3] = 0;
    if (((ulong)pQVar12 & 1) == 0) {
      puVar7[7] = 0;
      return (QChar *)this;
    }
    if ((*puVar7 & 1) != 0) {
      QVar5.ucs = L'�';
      if ((*puVar7 & 2) != 0) {
        QVar5.ucs = L'\0';
      }
      *(char16_t *)this = QVar5.ucs;
      return (QChar *)(this + 2);
    }
    puVar7[2] = 1;
    puVar7[3] = 0;
    QVar6 = pQVar8[(long)&out->ucs + -1];
  }
  puVar7[7] = (int)(char)QVar6;
  return (QChar *)this;
}

Assistant:

QChar *QUtf16::convertToUnicode(QChar *out, QByteArrayView in, QStringConverter::State *state, DataEndianness endian)
{
    qsizetype len = in.size();
    const char *chars = in.data();

    Q_ASSERT(state);

    if (endian == DetectEndianness)
        endian = (DataEndianness)state->state_data[Endian];

    const char *end = chars + len;

    // make sure we can decode at least one char
    if (state->remainingChars + len < 2) {
        if (len) {
            Q_ASSERT(state->remainingChars == 0 && len == 1);
            state->remainingChars = 1;
            state->state_data[Data] = *chars;
        }
        return out;
    }

    bool headerdone = state && state->internalState & HeaderDone;
    if (state->flags & QStringConverter::Flag::ConvertInitialBom)
        headerdone = true;

    if (!headerdone || state->remainingChars) {
        uchar buf;
        if (state->remainingChars)
            buf = state->state_data[Data];
        else
            buf = *chars++;

        // detect BOM, set endianness
        state->internalState |= HeaderDone;
        QChar ch(buf, *chars++);
        if (endian == DetectEndianness) {
            // someone set us up the BOM
            if (ch == QChar::ByteOrderSwapped) {
                endian = BigEndianness;
            } else if (ch == QChar::ByteOrderMark) {
                endian = LittleEndianness;
            } else {
                if (QSysInfo::ByteOrder == QSysInfo::BigEndian) {
                    endian = BigEndianness;
                } else {
                    endian = LittleEndianness;
                }
            }
        }
        if (endian == BigEndianness)
            ch = QChar::fromUcs2((ch.unicode() >> 8) | ((ch.unicode() & 0xff) << 8));
        if (headerdone || ch != QChar::ByteOrderMark)
            *out++ = ch;
    } else if (endian == DetectEndianness) {
        endian = (QSysInfo::ByteOrder == QSysInfo::BigEndian) ? BigEndianness : LittleEndianness;
    }

    qsizetype nPairs = (end - chars) >> 1;
    if (endian == BigEndianness)
        qFromBigEndian<char16_t>(chars, nPairs, out);
    else
        qFromLittleEndian<char16_t>(chars, nPairs, out);
    out += nPairs;

    state->state_data[Endian] = endian;
    state->remainingChars = 0;
    if ((end - chars) & 1) {
        if (state->flags & QStringConverter::Flag::Stateless) {
            *out++ = state->flags & QStringConverter::Flag::ConvertInvalidToNull ? QChar::Null : QChar::ReplacementCharacter;
        } else {
            state->remainingChars = 1;
            state->state_data[Data] = *(end - 1);
        }
    } else {
        state->state_data[Data] = 0;
    }

    return out;
}